

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-sys-linux.c
# Opt level: O0

raplcap_msr_sys_ctx * msr_sys_init(uint32_t *n_pkg,uint32_t *n_die)

{
  FILE *pFVar1;
  uint32_t ncpus_00;
  int iVar2;
  uint32_t uVar3;
  int *piVar4;
  char *pcVar5;
  msr_topology *topo_00;
  uint32_t *cpus_to_open_00;
  int err_save;
  uint32_t ncpus;
  uint32_t *cpus_to_open;
  raplcap_msr_sys_ctx *ctx;
  msr_topology *topo;
  uint32_t *n_die_local;
  uint32_t *n_pkg_local;
  
  if (n_pkg == (uint32_t *)0x0) {
    __assert_fail("n_pkg",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-sys-linux.c"
                  ,0xdf,"raplcap_msr_sys_ctx *msr_sys_init(uint32_t *, uint32_t *)");
  }
  if (n_die != (uint32_t *)0x0) {
    ncpus_00 = get_cpu_count();
    if (ncpus_00 == 0) {
      fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
      pFVar1 = _stderr;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(pFVar1,"%s: %s\n","msr_sys_init: get_cpu_count",pcVar5);
      n_pkg_local = (uint32_t *)0x0;
    }
    else {
      topo_00 = (msr_topology *)malloc((ulong)ncpus_00 * 0xc);
      if (topo_00 == (msr_topology *)0x0) {
        fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
        pFVar1 = _stderr;
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(pFVar1,"%s: %s\n","msr_sys_init: malloc",pcVar5);
        n_pkg_local = (uint32_t *)0x0;
      }
      else {
        iVar2 = get_topology(topo_00,ncpus_00);
        if (iVar2 == 0) {
          qsort(topo_00,(ulong)ncpus_00,0xc,cmp_msr_topology_pkg_die);
          n_pkg_local = (uint32_t *)malloc(0x18);
          if ((raplcap_msr_sys_ctx *)n_pkg_local == (raplcap_msr_sys_ctx *)0x0) {
            fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
            pFVar1 = _stderr;
            piVar4 = __errno_location();
            pcVar5 = strerror(*piVar4);
            fprintf(pFVar1,"%s: %s\n","msr_sys_init: malloc",pcVar5);
            free(topo_00);
            n_pkg_local = (uint32_t *)0x0;
          }
          else {
            ((raplcap_msr_sys_ctx *)n_pkg_local)->n_pkg = topo_00[ncpus_00 - 1].pkg + 1;
            ((raplcap_msr_sys_ctx *)n_pkg_local)->n_die = topo_00[ncpus_00 - 1].die + 1;
            uVar3 = count_unique_pkg_die(topo_00,ncpus_00);
            ((raplcap_msr_sys_ctx *)n_pkg_local)->n_fds = uVar3;
            cpus_to_open_00 =
                 (uint32_t *)malloc((ulong)((raplcap_msr_sys_ctx *)n_pkg_local)->n_fds << 2);
            if (cpus_to_open_00 == (uint32_t *)0x0) {
              fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
              pFVar1 = _stderr;
              piVar4 = __errno_location();
              pcVar5 = strerror(*piVar4);
              fprintf(pFVar1,"%s: %s\n","msr_sys_init: malloc",pcVar5);
              free(n_pkg_local);
              free(topo_00);
              n_pkg_local = (uint32_t *)0x0;
            }
            else {
              get_cpus_to_open(cpus_to_open_00,((raplcap_msr_sys_ctx *)n_pkg_local)->n_fds,topo_00,
                               ncpus_00);
              piVar4 = (int *)calloc((ulong)((raplcap_msr_sys_ctx *)n_pkg_local)->n_fds,4);
              ((raplcap_msr_sys_ctx *)n_pkg_local)->fds = piVar4;
              if (piVar4 == (int *)0x0) {
                fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
                pFVar1 = _stderr;
                piVar4 = __errno_location();
                pcVar5 = strerror(*piVar4);
                fprintf(pFVar1,"%s: %s\n","msr_sys_init: calloc",pcVar5);
                free(cpus_to_open_00);
                free(n_pkg_local);
                free(topo_00);
                n_pkg_local = (uint32_t *)0x0;
              }
              else {
                iVar2 = open_msrs(((raplcap_msr_sys_ctx *)n_pkg_local)->fds,cpus_to_open_00,
                                  ((raplcap_msr_sys_ctx *)n_pkg_local)->n_fds);
                if (iVar2 == 0) {
                  free(cpus_to_open_00);
                  free(topo_00);
                  *n_pkg = ((raplcap_msr_sys_ctx *)n_pkg_local)->n_pkg;
                  *n_die = ((raplcap_msr_sys_ctx *)n_pkg_local)->n_die;
                }
                else {
                  piVar4 = __errno_location();
                  iVar2 = *piVar4;
                  free(cpus_to_open_00);
                  msr_sys_destroy((raplcap_msr_sys_ctx *)n_pkg_local);
                  free(topo_00);
                  piVar4 = __errno_location();
                  *piVar4 = iVar2;
                  n_pkg_local = (uint32_t *)0x0;
                }
              }
            }
          }
        }
        else {
          free(topo_00);
          n_pkg_local = (uint32_t *)0x0;
        }
      }
    }
    return (raplcap_msr_sys_ctx *)n_pkg_local;
  }
  __assert_fail("n_die",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-sys-linux.c"
                ,0xe0,"raplcap_msr_sys_ctx *msr_sys_init(uint32_t *, uint32_t *)");
}

Assistant:

raplcap_msr_sys_ctx* msr_sys_init(uint32_t* n_pkg, uint32_t* n_die) {
  msr_topology* topo;
  raplcap_msr_sys_ctx* ctx;
  uint32_t* cpus_to_open;
  uint32_t ncpus;
  int err_save;
  assert(n_pkg);
  assert(n_die);
  // need to decide which CPU MSRs to open to cover all RAPL zones
  if ((ncpus = get_cpu_count()) == 0) {
    raplcap_perror(ERROR, "msr_sys_init: get_cpu_count");
    return NULL;
  }
  if ((topo = malloc(ncpus * sizeof(*topo))) == NULL) {
    raplcap_perror(ERROR, "msr_sys_init: malloc");
    return NULL;
  }
  // get topology for all CPUs, sort by pkg and die, then count unique combinations to determine how many MSRs to open
  if (get_topology(topo, ncpus)) {
    free(topo);
    return NULL;
  }
  qsort(topo, ncpus, sizeof(*topo), cmp_msr_topology_pkg_die);
  if ((ctx = malloc(sizeof(*ctx))) == NULL) {
    raplcap_perror(ERROR, "msr_sys_init: malloc");
    free(topo);
    return NULL;
  }
  // assumes homogeneous die configurations across packages
  ctx->n_pkg = topo[ncpus - 1].pkg + 1;
  ctx->n_die = topo[ncpus - 1].die + 1;
  ctx->n_fds = count_unique_pkg_die(topo, ncpus);
  raplcap_log(DEBUG, "msr_sys_init: n_cpus=%"PRIu32", n_pkg=%"PRIu32", n_die=%"PRIu32", n_fds=%"PRIu32"\n",
              ncpus, ctx->n_pkg, ctx->n_die, ctx->n_fds);
  // now determine which CPUs to open MSRs for and do it
  if ((cpus_to_open = malloc(ctx->n_fds * sizeof(uint32_t))) == NULL) {
    raplcap_perror(ERROR, "msr_sys_init: malloc");
    free(ctx);
    free(topo);
    return NULL;
  }
  get_cpus_to_open(cpus_to_open, ctx->n_fds, topo, ncpus);
  if ((ctx->fds = calloc(ctx->n_fds, sizeof(int))) == NULL) {
    raplcap_perror(ERROR, "msr_sys_init: calloc");
    free(cpus_to_open);
    free(ctx);
    free(topo);
    return NULL;
  }
  if (open_msrs(ctx->fds, cpus_to_open, ctx->n_fds)) {
    err_save = errno;
    free(cpus_to_open);
    msr_sys_destroy(ctx);
    free(topo);
    errno = err_save;
    return NULL;
  }
  free(cpus_to_open);
  free(topo);
  *n_pkg = ctx->n_pkg;
  *n_die = ctx->n_die;
  return ctx;
}